

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_syntax.c
# Opt level: O0

void fill_slice_parameters(H265eCtx *h,H265eSlicParams *sp)

{
  MppEncCfgSet *pMVar1;
  H265eSlice *pHVar2;
  bool local_2c;
  bool local_2b;
  bool local_2a;
  bool local_29;
  H265eSlice *slice;
  MppEncH265Cfg *codec;
  H265eSlicParams *sp_local;
  H265eCtx *h_local;
  
  pMVar1 = h->cfg;
  pHVar2 = h->slice;
  memset(sp,0,0x44);
  if ((pMVar1->codec).field_1.h265.slice_cfg.split_enable != 0) {
    (sp->field_0).CodingSliceFlags = (sp->field_0).CodingSliceFlags & 0xfffffffb | 4;
    (sp->field_0).CodingSliceFlags = (sp->field_0).CodingSliceFlags & 0xfffffffe | 1;
    (sp->field_0).CodingSliceFlags =
         (sp->field_0).CodingSliceFlags & 0xfffffffd |
         ((pMVar1->codec).field_1.h265.slice_cfg.split_mode & 1) << 1;
    if ((pMVar1->codec).field_1.h265.slice_cfg.split_mode == 0) {
      sp->sli_splt_byte = (pMVar1->codec).field_1.h265.slice_cfg.slice_size;
    }
    else {
      sp->sli_splt_cnum_m1 = (short)(pMVar1->codec).field_1.h265.slice_cfg.slice_size - 1;
    }
    sp->sli_max_num_m1 = 0x32;
    (sp->field_0).CodingSliceFlags = (sp->field_0).CodingSliceFlags & 0xfffffff7 | 8;
  }
  (sp->field_0).CodingSliceFlags =
       (sp->field_0).CodingSliceFlags & 0xffffffef | (pHVar2->m_cabacInitFlag & 1) << 4;
  (sp->field_0).CodingSliceFlags =
       (sp->field_0).CodingSliceFlags & 0xffffffdf | (pHVar2->m_bLMvdL1Zero & 1) << 5;
  (sp->field_0).CodingSliceFlags =
       (sp->field_0).CodingSliceFlags & 0xffffffbf |
       ((pMVar1->codec).field_1.h265.merge_cfg.merge_up_flag & 1) << 6;
  (sp->field_0).CodingSliceFlags =
       (sp->field_0).CodingSliceFlags & 0xffffff7f |
       ((pMVar1->codec).field_1.h265.merge_cfg.merge_left_flag & 1) << 7;
  (sp->field_0).CodingSliceFlags =
       (sp->field_0).CodingSliceFlags & 0xfffffeff |
       (pHVar2->ref_pic_list_modification_flag_l0 & 1) << 8;
  sp->num_refidx_l1_act = '\0';
  sp->num_refidx_l0_act = '\0';
  local_29 = true;
  if (pHVar2->m_numRefIdx[0] == pHVar2->m_pps->m_numRefIdxL0DefaultActive) {
    local_2a = false;
    if (pHVar2->m_sliceType == B_SLICE) {
      local_2a = pHVar2->m_numRefIdx[1] != pHVar2->m_pps->m_numRefIdxL1DefaultActive;
    }
    local_29 = local_2a;
  }
  (sp->field_0).CodingSliceFlags = (sp->field_0).CodingSliceFlags & 0xfffffdff | (uint)local_29 << 9
  ;
  local_2b = false;
  if (pHVar2->m_sps->m_bUseSAO != 0) {
    local_2b = pHVar2->m_saoEnabledFlagChroma != 0;
  }
  (sp->field_0).CodingSliceFlags =
       (sp->field_0).CodingSliceFlags & 0xfffffbff | (uint)local_2b << 10;
  local_2c = false;
  if (pHVar2->m_sps->m_bUseSAO != 0) {
    local_2c = pHVar2->m_saoEnabledFlag != 0;
  }
  (sp->field_0).CodingSliceFlags =
       (sp->field_0).CodingSliceFlags & 0xfffff7ff | (uint)local_2c << 0xb;
  (sp->field_0).CodingSliceFlags =
       (sp->field_0).CodingSliceFlags & 0xffffefff | (pHVar2->m_enableTMVPFlag & 1) << 0xc;
  (sp->field_0).CodingSliceFlags =
       (sp->field_0).CodingSliceFlags & 0xffffdfff | (pHVar2->m_picOutputFlag & 1) << 0xd;
  sp->slice_type = (RK_U8)pHVar2->m_sliceType;
  sp->slice_rsrv_flg = '\0';
  (sp->field_0).CodingSliceFlags = (sp->field_0).CodingSliceFlags & 0xffffbfff;
  sp->sli_pps_id = (RK_U8)pHVar2->m_pps->m_PPSId;
  (sp->field_0).CodingSliceFlags =
       (sp->field_0).CodingSliceFlags & 0xffff7fff |
       (pHVar2->no_output_of_prior_pics_flag & 1) << 0xf;
  sp->sli_tc_ofst_div2 = (RK_S8)pHVar2->m_deblockingFilterTcOffsetDiv2;
  sp->sli_beta_ofst_div2 = (RK_S8)pHVar2->m_deblockingFilterBetaOffsetDiv2;
  (sp->field_0).CodingSliceFlags =
       (sp->field_0).CodingSliceFlags & 0xfffeffff |
       (pHVar2->m_LFCrossSliceBoundaryFlag & 1) << 0x10;
  (sp->field_0).CodingSliceFlags =
       (sp->field_0).CodingSliceFlags & 0xfffdffff | (pHVar2->m_deblockingFilterDisable & 1) << 0x11
  ;
  (sp->field_0).CodingSliceFlags =
       (sp->field_0).CodingSliceFlags & 0xfffbffff |
       (pHVar2->m_deblockingFilterOverrideFlag & 1) << 0x12;
  sp->sli_cb_qp_ofst = (RK_S8)pHVar2->m_sliceQpDeltaCb;
  sp->sli_qp = (RK_U8)pHVar2->m_sliceQp;
  sp->max_mrg_cnd = (RK_U8)pHVar2->m_maxNumMergeCand;
  sp->temporal_id = pHVar2->temporal_id;
  sp->non_reference_flag = pHVar2->m_temporalLayerNonReferenceFlag;
  (sp->field_0).CodingSliceFlags = (sp->field_0).CodingSliceFlags & 0xfff7ffff;
  (sp->field_0).CodingSliceFlags =
       (sp->field_0).CodingSliceFlags & 0xffefffff | (pHVar2->m_colFromL0Flag & 1) << 0x14;
  sp->sli_poc_lsb =
       (RK_U16)(((pHVar2->poc - pHVar2->last_idr) +
                (1 << ((byte)pHVar2->m_sps->m_bitsForPOC & 0x1f))) %
               (1 << ((byte)pHVar2->m_sps->m_bitsForPOC & 0x1f)));
  sp->sli_hdr_ext_len = (RK_U16)pHVar2->slice_header_extension_length;
  return;
}

Assistant:

static void fill_slice_parameters( const H265eCtx *h,
                                   H265eSlicParams *sp)
{
    MppEncH265Cfg *codec = &h->cfg->codec.h265;
    H265eSlice  *slice = h->slice;
    memset(sp, 0, sizeof(H265eSlicParams));
    if (codec->slice_cfg.split_enable) {
        sp->sli_splt_cpst = 1;
        sp->sli_splt = 1;
        sp->sli_splt_mode = codec->slice_cfg.split_mode;
        if (codec->slice_cfg.split_mode) {
            sp->sli_splt_cnum_m1 = codec->slice_cfg.slice_size - 1;
        } else {
            sp->sli_splt_byte = codec->slice_cfg.slice_size;
        }
        sp->sli_max_num_m1 = 50;
        sp->sli_flsh = 1;
    }

    sp->cbc_init_flg        = slice->m_cabacInitFlag;
    sp->mvd_l1_zero_flg     = slice->m_bLMvdL1Zero;
    sp->merge_up_flag       = codec->merge_cfg.merge_up_flag;
    sp->merge_left_flag     = codec->merge_cfg.merge_left_flag;
    sp->ref_pic_lst_mdf_l0  = slice->ref_pic_list_modification_flag_l0;

    sp->num_refidx_l1_act   = 0;
    sp->num_refidx_l0_act   = 0;

    sp->num_refidx_act_ovrd = (((RK_U32)slice->m_numRefIdx[0] != slice->m_pps->m_numRefIdxL0DefaultActive)
                               || (slice->m_sliceType == B_SLICE &&
                                   (RK_U32)slice->m_numRefIdx[1] != slice->m_pps->m_numRefIdxL1DefaultActive));

    sp->sli_sao_chrm_flg    = slice->m_sps->m_bUseSAO && slice->m_saoEnabledFlagChroma;
    sp->sli_sao_luma_flg    = slice->m_sps->m_bUseSAO && slice->m_saoEnabledFlag;
    sp->sli_tmprl_mvp_en    = slice->m_enableTMVPFlag;

    sp->pic_out_flg         = slice->m_picOutputFlag;
    sp->slice_type          = slice->m_sliceType;
    sp->slice_rsrv_flg      = 0;
    sp->dpdnt_sli_seg_flg   = 0;
    sp->sli_pps_id          = slice->m_pps->m_PPSId;
    sp->no_out_pri_pic      = slice->no_output_of_prior_pics_flag;

    sp->sli_tc_ofst_div2 = slice->m_deblockingFilterTcOffsetDiv2;
    sp->sli_beta_ofst_div2 = slice->m_deblockingFilterBetaOffsetDiv2;
    sp->sli_lp_fltr_acrs_sli = slice->m_LFCrossSliceBoundaryFlag;
    sp->sli_dblk_fltr_dis = slice->m_deblockingFilterDisable;
    sp->dblk_fltr_ovrd_flg = slice->m_deblockingFilterOverrideFlag;
    sp->sli_cb_qp_ofst = slice->m_sliceQpDeltaCb;
    sp->sli_qp = slice->m_sliceQp;
    sp->max_mrg_cnd = slice->m_maxNumMergeCand;
    sp->temporal_id = slice->temporal_id;
    sp->non_reference_flag = slice->m_temporalLayerNonReferenceFlag;
    sp->col_ref_idx = 0;
    sp->col_frm_l0_flg = slice->m_colFromL0Flag;
    sp->sli_poc_lsb = (slice->poc - slice->last_idr + (1 << slice->m_sps->m_bitsForPOC)) %
                      (1 << slice->m_sps->m_bitsForPOC);
    sp->sli_hdr_ext_len = slice->slice_header_extension_length;
}